

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute(XmlWriter *this,string *name,char *attribute)

{
  ulong uVar1;
  ostream *poVar2;
  string *str;
  XmlEncode *in_RDX;
  string *in_RSI;
  XmlWriter *in_RDI;
  XmlEncode *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  allocator local_61;
  string local_60 [72];
  XmlEncode *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((((uVar1 & 1) == 0) && (local_18 != (XmlEncode *)0x0)) && (local_18->m_str != (string)0x0)) {
    poVar2 = std::operator<<(in_RDI->m_os,' ');
    poVar2 = std::operator<<(poVar2,local_10);
    str = (string *)std::operator<<(poVar2,"=\"");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,(char *)local_18,&local_61);
    XmlEncode::XmlEncode(local_18,str,(ForWhat)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    poVar2 = anon_unknown_14::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::operator<<(poVar2,'\"');
    XmlEncode::~XmlEncode((XmlEncode *)0x12ede4);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, const char* attribute ) {
        if( !name.empty() && attribute && attribute[0] != '\0' )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }